

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBeamSectionTaperedTimoshenko.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChBeamSectionTimoshenkoAdvancedGeneric::SetMainInertiasInMassReference
          (ChBeamSectionTimoshenkoAdvancedGeneric *this,double Jmyy,double Jmzz,double Jmyz,
          double mass_phi,double Qmy,double Qmz)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar21;
  double dVar22;
  double dVar23;
  undefined8 in_XMM0_Qb;
  undefined8 extraout_XMM0_Qb;
  ulong extraout_XMM0_Qb_00;
  undefined1 auVar24 [64];
  undefined8 in_XMM1_Qb;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined8 in_XMM2_Qb;
  undefined1 auVar28 [16];
  undefined8 in_XMM4_Qb;
  undefined1 auVar29 [16];
  undefined8 in_XMM5_Qb;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  double local_48;
  double dStack_40;
  double local_18;
  double dStack_10;
  undefined1 extraout_var [56];
  
  dVar1 = (this->super_ChBeamSectionRayleighAdvancedGeneric).super_ChBeamSectionEulerAdvancedGeneric
          .Mz;
  dVar2 = (this->super_ChBeamSectionRayleighAdvancedGeneric).super_ChBeamSectionEulerAdvancedGeneric
          .mu;
  dVar3 = (this->super_ChBeamSectionRayleighAdvancedGeneric).super_ChBeamSectionEulerAdvancedGeneric
          .My;
  dVar4 = dVar2 * dVar1;
  dVar2 = dVar2 * dVar3;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar2;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar4;
  auVar5 = vunpcklpd_avx(auVar20,auVar25);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar3 * dVar2;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar1 * dVar4;
  auVar17 = vunpcklpd_avx(auVar13,auVar18);
  dVar21 = cos(mass_phi);
  dVar22 = sin(mass_phi);
  dVar23 = cos(mass_phi + mass_phi);
  auVar24._0_8_ = sin(mass_phi + mass_phi);
  auVar24._8_56_ = extraout_var;
  auVar6._8_8_ = extraout_XMM0_Qb;
  auVar6._0_8_ = dVar21;
  auVar14._8_8_ = extraout_XMM0_Qb_00;
  auVar14._0_8_ = dVar22;
  auVar16._0_8_ = -dVar22;
  auVar16._8_8_ = extraout_XMM0_Qb_00 ^ 0x8000000000000000;
  auVar25 = vunpcklpd_avx(auVar6,auVar16);
  auVar14 = vunpcklpd_avx(auVar14,auVar6);
  dVar3 = (this->super_ChBeamSectionRayleighAdvancedGeneric).super_ChBeamSectionEulerAdvancedGeneric
          .My;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar3;
  dVar4 = (this->super_ChBeamSectionRayleighAdvancedGeneric).super_ChBeamSectionEulerAdvancedGeneric
          .Mz;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar4;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar21 * (dVar4 + dVar4);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = dVar22 * dVar3 * -2.0;
  auVar18 = vunpcklpd_avx(auVar35,auVar37);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = dVar22 * (dVar4 + dVar4);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = dVar21 * (dVar3 + dVar3);
  auVar19 = vunpcklpd_avx(auVar34,auVar38);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = dVar21 * dVar21;
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar22 * dVar22;
  auVar20 = vunpcklpd_avx(auVar26,auVar28);
  auVar26 = vunpcklpd_avx(auVar28,auVar26);
  auVar12._0_8_ = -auVar24._0_8_;
  auVar12._8_8_ = extraout_var._0_8_ ^ 0x8000000000000000;
  auVar27 = vunpcklpd_avx(auVar24._0_16_,auVar12);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar22 * dVar4;
  auVar28 = vfmsub231sd_fma(auVar15,auVar30,auVar6);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar22 * dVar3;
  auVar6 = vfmadd231sd_fma(auVar31,auVar32,auVar6);
  auVar7._8_8_ = in_XMM4_Qb;
  auVar7._0_8_ = Qmy;
  auVar12 = vmovddup_avx512vl(auVar7);
  auVar29._0_8_ = auVar12._0_8_ * auVar25._0_8_;
  auVar29._8_8_ = auVar12._8_8_ * auVar25._8_8_;
  auVar9._8_8_ = in_XMM5_Qb;
  auVar9._0_8_ = Qmz;
  auVar13 = vmovddup_avx512vl(auVar9);
  auVar25 = vfmadd231pd_fma(auVar29,auVar13,auVar14);
  auVar8._8_8_ = in_XMM0_Qb;
  auVar8._0_8_ = Jmyy;
  auVar14 = vmovddup_avx512vl(auVar8);
  auVar29 = ZEXT816(0) << 0x40;
  auVar25 = vfmadd231pd_fma(auVar25,auVar14,auVar29);
  auVar10._8_8_ = in_XMM1_Qb;
  auVar10._0_8_ = Jmzz;
  auVar15 = vmovddup_avx512vl(auVar10);
  auVar25 = vfmadd231pd_fma(auVar25,auVar15,auVar29);
  auVar11._8_8_ = in_XMM2_Qb;
  auVar11._0_8_ = Jmyz;
  auVar16 = vmovddup_avx512vl(auVar11);
  auVar25 = vfmadd231pd_fma(auVar25,auVar16,auVar29);
  local_48 = auVar5._0_8_;
  dStack_40 = auVar5._8_8_;
  auVar36._0_8_ = auVar12._0_8_ * auVar18._0_8_;
  auVar36._8_8_ = auVar12._8_8_ * auVar18._8_8_;
  auVar5 = vfmadd231pd_fma(auVar36,auVar13,auVar19);
  auVar5 = vfmadd231pd_fma(auVar5,auVar14,auVar20);
  auVar5 = vfmadd231pd_fma(auVar5,auVar15,auVar26);
  auVar5 = vfmadd231pd_fma(auVar5,auVar16,auVar27);
  local_18 = auVar17._0_8_;
  dStack_10 = auVar17._8_8_;
  auVar27._0_8_ = auVar5._0_8_ + local_18;
  auVar27._8_8_ = auVar5._8_8_ + dStack_10;
  auVar17 = vmulsd_avx512f(auVar28,auVar7);
  auVar14 = vmulsd_avx512f(auVar6,auVar9);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = auVar24._0_8_ * -0.5;
  auVar18 = vmulsd_avx512f(auVar33,auVar8);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = auVar24._0_8_ * 0.5;
  auVar19 = vmulsd_avx512f(auVar19,auVar10);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = dVar23;
  auVar20 = vmulsd_avx512f(auVar11,auVar5);
  this->Qy = auVar25._0_8_ + local_48;
  this->Qz = auVar25._8_8_ + dStack_40;
  auVar5 = vshufpd_avx(auVar27,auVar27,1);
  (this->super_ChBeamSectionRayleighAdvancedGeneric).Jzz = (double)auVar5._0_8_;
  (this->super_ChBeamSectionRayleighAdvancedGeneric).Jyy = (double)auVar5._8_8_;
  (this->super_ChBeamSectionRayleighAdvancedGeneric).Jyz =
       auVar17._0_8_ + auVar14._0_8_ + auVar18._0_8_ + auVar19._0_8_ + auVar20._0_8_ + dVar1 * dVar2
  ;
  auVar17._0_8_ = auVar27._0_8_ + auVar27._8_8_;
  auVar17._8_8_ = auVar27._0_8_ + auVar27._8_8_;
  dVar1 = (double)vmovlpd_avx(auVar17);
  (this->super_ChBeamSectionRayleighAdvancedGeneric).super_ChBeamSectionEulerAdvancedGeneric.Jxx =
       dVar1;
  return;
}

Assistant:

void ChBeamSectionTimoshenkoAdvancedGeneric::SetMainInertiasInMassReference(const double Jmyy,
                                                                            const double Jmzz,
                                                                            const double Jmyz,
                                                                            const double mass_phi,
                                                                            const double Qmy,
                                                                            const double Qmz) {
    // define a vector of local mass properties expressed in mass center coordinate system
    EigenMat5x1 Jm_vec;
    // Jm_vec << Qmy, Qmz, Jmyy, Jmzz, Jmyz;
    Jm_vec(0) = Qmy;
    Jm_vec(1) = Qmz;
    Jm_vec(2) = Jmyy;
    Jm_vec(3) = Jmzz;
    Jm_vec(4) = Jmyz;

    // A constant vector, which is from the mass center offset (My,Mz)
    EigenMat5x1 const_vec;
    const_vec.setZero();
    const_vec(0) = this->mu * this->Mz;
    const_vec(1) = this->mu * this->My;
    const_vec(2) = this->mu * this->Mz * this->Mz;
    const_vec(3) = this->mu * this->My * this->My;
    const_vec(4) = this->mu * this->My * this->Mz;

    // Transformation matrix from the mass center coordinate system to the centerline of beam
    EigenMat5x5 Acog2cl;
    Acog2cl.setZero();
    double cosphi = cos(mass_phi);
    double sinphi = sin(mass_phi);
    double cos2phi = cos(2. * mass_phi);
    double sin2phi = sin(2. * mass_phi);
    double cosphi2 = cosphi * cosphi;
    double sinphi2 = sinphi * sinphi;

    Acog2cl(0, 0) = cosphi;
    Acog2cl(0, 1) = sinphi;

    Acog2cl(1, 0) = -sinphi;
    Acog2cl(1, 1) = cosphi;

    Acog2cl(2, 0) = 2. * this->Mz * cosphi;
    Acog2cl(2, 1) = 2. * this->Mz * sinphi;
    Acog2cl(2, 2) = cosphi2;
    Acog2cl(2, 3) = sinphi2;
    Acog2cl(2, 4) = sin2phi;

    Acog2cl(3, 0) = -2. * this->My * sinphi;
    Acog2cl(3, 1) = 2. * this->My * cosphi;
    Acog2cl(3, 2) = sinphi2;
    Acog2cl(3, 3) = cosphi2;
    Acog2cl(3, 4) = -sin2phi;

    Acog2cl(4, 0) = this->My * cosphi - this->Mz * sinphi;
    Acog2cl(4, 1) = this->Mz * cosphi + this->My * sinphi;
    Acog2cl(4, 2) = -1. / 2. * sin2phi;
    Acog2cl(4, 3) = 1. / 2. * sin2phi;
    Acog2cl(4, 4) = cos2phi;

    EigenMat5x1 J_vec;
    J_vec.setZero();
    J_vec = const_vec + Acog2cl * Jm_vec;

    this->Qy = J_vec(0);
    this->Qz = J_vec(1);
    this->Jyy = J_vec(2);
    this->Jzz = J_vec(3);
    this->Jyz = J_vec(4);
    // Automatically set parent Jxx value
    this->Jxx = (this->Jyy + this->Jzz);
}